

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

ConfigError * CLI::ConfigError::Extras(ConfigError *__return_storage_ptr__,string *item)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  string *local_18;
  string *item_local;
  
  local_18 = item;
  item_local = (string *)__return_storage_ptr__;
  ::std::operator+(&local_38,"INI was not able to parse ",item);
  ConfigError(__return_storage_ptr__,&local_38);
  ::std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

static ConfigError Extras(std::string item) { return ConfigError("INI was not able to parse " + item); }